

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::ClockingEventExpression>
          (PropagationVisitor *this,ClockingEventExpression *expr)

{
  Type *pTVar1;
  ASTContext *context;
  ClockingEventExpression *expr_00;
  bool bVar2;
  Type *rhs;
  SourceLocation loc;
  ClockingEventExpression *local_40;
  Expression *result;
  Type *pTStack_30;
  bool needConversion;
  Type *local_28;
  ClockingEventExpression *local_20;
  ClockingEventExpression *expr_local;
  PropagationVisitor *this_local;
  
  local_20 = expr;
  expr_local = (ClockingEventExpression *)this;
  bVar2 = Expression::bad(&expr->super_Expression);
  if (bVar2) {
    this_local = (PropagationVisitor *)local_20;
  }
  else {
    bVar2 = Type::isError(this->newType);
    if (bVar2) {
      pTStack_30 = this->newType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_28,&stack0xffffffffffffffd0);
      (local_20->super_Expression).type.ptr = local_28;
      this_local = (PropagationVisitor *)local_20;
    }
    else {
      pTVar1 = this->newType;
      rhs = not_null<const_slang::ast::Type_*>::operator*(&(local_20->super_Expression).type);
      bVar2 = Type::isEquivalent(pTVar1,rhs);
      local_40 = local_20;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar2 = SourceLocation::operator_cast_to_bool(&this->assignmentLoc);
        expr_00 = local_20;
        if (bVar2) {
          local_40 = (ClockingEventExpression *)
                     ConversionExpression::makeImplicit
                               (this->context,this->newType,Implicit,&local_20->super_Expression,
                                this->assignmentLoc);
        }
        else {
          context = this->context;
          pTVar1 = this->newType;
          loc = SourceRange::start(&(local_20->super_Expression).sourceRange);
          local_40 = (ClockingEventExpression *)
                     ConversionExpression::makeImplicit
                               (context,pTVar1,Propagated,&expr_00->super_Expression,loc);
        }
      }
      this_local = (PropagationVisitor *)local_40;
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }